

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_use_port(connectdata *conn,ftpport fcmd)

{
  SessionHandle *data_00;
  Curl_dns_entry *pCVar1;
  sockaddr **ppsVar2;
  uint16_t uVar3;
  uint remote_scope;
  if2ip_result_t iVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  int *piVar9;
  undefined8 uVar10;
  bool bVar11;
  size_t local_a58;
  int *local_a50;
  char *dest;
  char *source;
  char *port_sep;
  char *port_start;
  char *ip_end;
  char *ip_start;
  size_t addrlen;
  char *addr;
  _Bool possibly_non_local;
  unsigned_short port;
  unsigned_short port_max;
  Curl_dns_entry *pCStack_a08;
  unsigned_short port_min;
  Curl_dns_entry *h;
  char *string_ftpport;
  char *host;
  int error;
  int rc;
  char tmp [1024];
  sockaddr_in *sa4;
  sockaddr *sa;
  char hbuf [1025];
  socklen_t local_1cc;
  Curl_addrinfo *pCStack_1c8;
  curl_socklen_t sslen;
  Curl_addrinfo *ai;
  Curl_addrinfo *res;
  Curl_sockaddr_storage ss;
  char myhost [256];
  curl_socket_t portsock;
  SessionHandle *data;
  ftp_conn *ftpc;
  CURLcode result;
  ftpport fcmd_local;
  connectdata *conn_local;
  
  ftpc._0_4_ = CURLE_OK;
  data_00 = conn->data;
  myhost[0xfc] = -1;
  myhost[0xfd] = -1;
  myhost[0xfe] = -1;
  myhost[0xff] = -1;
  memset((void *)((long)&ss.buffer + 0x78),0,0x100);
  string_ftpport = (char *)0x0;
  h = (Curl_dns_entry *)(data_00->set).str[9];
  pCStack_a08 = (Curl_dns_entry *)0x0;
  addr._6_2_ = 0;
  addr._4_2_ = 0;
  bVar11 = true;
  addrlen = 0;
  ppsVar2 = (sockaddr **)string_ftpport;
  tmp._1016_8_ = (sockaddr *)&res;
  if (((data_00->set).str[9] != (char *)0x0) &&
     (sVar6 = strlen((data_00->set).str[9]), ppsVar2 = (sockaddr **)string_ftpport, 1 < sVar6)) {
    sVar6 = strlen((char *)h);
    if (sVar6 < 0x10) {
      local_a58 = 0x10;
    }
    else {
      local_a58 = strlen((char *)h);
    }
    pCVar1 = h;
    addrlen = (size_t)(*Curl_ccalloc)(local_a58 + 1,1);
    if ((char *)addrlen == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if (*(char *)&h->addr == ':') {
      port_start = (char *)h;
    }
    else {
      port_start = strchr((char *)h,0x3a);
      if (port_start == (char *)0x0) {
        strcpy((char *)addrlen,(char *)h);
      }
      else {
        strncpy((char *)addrlen,(char *)h,(long)port_start - (long)pCVar1);
      }
    }
    if ((port_start != (char *)0x0) && (pcVar7 = strchr(port_start,0x3a), pcVar7 != (char *)0x0)) {
      uVar8 = strtoul(pcVar7 + 1,(char **)0x0,10);
      addr._6_2_ = curlx_ultous(uVar8);
      pcVar7 = strchr(pcVar7,0x2d);
      addr._4_2_ = addr._6_2_;
      if (pcVar7 != (char *)0x0) {
        uVar8 = strtoul(pcVar7 + 1,(char **)0x0,10);
        addr._4_2_ = curlx_ultous(uVar8);
      }
    }
    if (addr._4_2_ < addr._6_2_) {
      addr._4_2_ = 0;
      addr._6_2_ = 0;
    }
    if (*(char *)addrlen == '\0') {
      string_ftpport = (char *)0x0;
      ppsVar2 = (sockaddr **)string_ftpport;
    }
    else {
      iVar5 = conn->ip_addr->ai_family;
      remote_scope = Curl_ipv6_scope(conn->ip_addr->ai_addr);
      iVar4 = Curl_if2ip(iVar5,remote_scope,conn->scope_id,(char *)addrlen,(char *)&sa,0x401);
      ppsVar2 = (sockaddr **)(char *)addrlen;
      if (iVar4 != IF2IP_NOT_FOUND) {
        if (iVar4 == IF2IP_AF_NOT_SUPPORTED) {
          return CURLE_FTP_PORT_FAILED;
        }
        ppsVar2 = (sockaddr **)string_ftpport;
        if (iVar4 == IF2IP_FOUND) {
          ppsVar2 = &sa;
        }
      }
    }
  }
  string_ftpport = (char *)ppsVar2;
  if (string_ftpport == (char *)0x0) {
    local_1cc = 0x80;
    iVar5 = getsockname(conn->sock[0],(sockaddr *)&res,&local_1cc);
    if (iVar5 != 0) {
      piVar9 = __errno_location();
      pcVar7 = Curl_strerror(conn,*piVar9);
      Curl_failf(data_00,"getsockname() failed: %s",pcVar7);
      (*Curl_cfree)((void *)addrlen);
      return CURLE_FTP_PORT_FAILED;
    }
    Curl_inet_ntop((uint)(ushort)res,(void *)(tmp._1016_8_ + 4),(char *)&sa,0x401);
    string_ftpport = (char *)&sa;
    bVar11 = false;
  }
  host._4_4_ = Curl_resolv(conn,string_ftpport,0,&stack0xfffffffffffff5f8);
  if (pCStack_a08 == (Curl_dns_entry *)0x0) {
    ai = (Curl_addrinfo *)0x0;
  }
  else {
    ai = pCStack_a08->addr;
    Curl_resolv_unlock(data_00,pCStack_a08);
  }
  if (ai == (Curl_addrinfo *)0x0) {
    Curl_failf(data_00,"failed to resolve the address provided to PORT: %s",string_ftpport);
    (*Curl_cfree)((void *)addrlen);
  }
  else {
    (*Curl_cfree)((void *)addrlen);
    string_ftpport = (char *)0x0;
    myhost[0xfc] = -1;
    myhost[0xfd] = -1;
    myhost[0xfe] = -1;
    myhost[0xff] = -1;
    host._0_4_ = 0;
    pCStack_1c8 = ai;
    while ((pCStack_1c8 != (Curl_addrinfo *)0x0 &&
           (ftpc._0_4_ = Curl_socket(conn,pCStack_1c8,(Curl_sockaddr_ex *)0x0,
                                     (curl_socket_t *)(myhost + 0xfc)), (CURLcode)ftpc != CURLE_OK))
          ) {
      piVar9 = __errno_location();
      host._0_4_ = *piVar9;
      pCStack_1c8 = pCStack_1c8->ai_next;
    }
    if (pCStack_1c8 == (Curl_addrinfo *)0x0) {
      pcVar7 = Curl_strerror(conn,(int)host);
      Curl_failf(data_00,"socket failure: %s",pcVar7);
    }
    else {
      memcpy((sockaddr *)&res,pCStack_1c8->ai_addr,(ulong)pCStack_1c8->ai_addrlen);
      local_1cc = pCStack_1c8->ai_addrlen;
      addr._2_2_ = addr._6_2_;
      while (addr._2_2_ <= addr._4_2_) {
        if ((ushort)res == 2) {
          uVar3 = htons(addr._2_2_);
          *(uint16_t *)(tmp._1016_8_ + 2) = uVar3;
        }
        iVar5 = bind(myhost._252_4_,(sockaddr *)&res,local_1cc);
        if (iVar5 == 0) break;
        piVar9 = __errno_location();
        host._0_4_ = *piVar9;
        if ((bVar11) && ((int)host == 99)) {
          pcVar7 = Curl_strerror(conn,99);
          Curl_infof(data_00,"bind(port=%hu) on non-local address failed: %s\n",(ulong)addr._2_2_,
                     pcVar7);
          local_1cc = 0x80;
          iVar5 = getsockname(conn->sock[0],(sockaddr *)&res,&local_1cc);
          if (iVar5 != 0) {
            piVar9 = __errno_location();
            pcVar7 = Curl_strerror(conn,*piVar9);
            Curl_failf(data_00,"getsockname() failed: %s",pcVar7);
            Curl_closesocket(conn,myhost._252_4_);
            return CURLE_FTP_PORT_FAILED;
          }
          addr._2_2_ = addr._6_2_;
          bVar11 = false;
        }
        else {
          if (((int)host != 0x62) && ((int)host != 0xd)) {
            pcVar7 = Curl_strerror(conn,(int)host);
            Curl_failf(data_00,"bind(port=%hu) failed: %s",(ulong)addr._2_2_,pcVar7);
            Curl_closesocket(conn,myhost._252_4_);
            return CURLE_FTP_PORT_FAILED;
          }
          addr._2_2_ = addr._2_2_ + 1;
        }
      }
      if (addr._4_2_ < addr._2_2_) {
        Curl_failf(data_00,"bind() failed, we ran out of ports!");
        Curl_closesocket(conn,myhost._252_4_);
      }
      else {
        local_1cc = 0x80;
        iVar5 = getsockname(myhost._252_4_,(sockaddr *)&res,&local_1cc);
        if (iVar5 == 0) {
          iVar5 = listen(myhost._252_4_,1);
          if (iVar5 == 0) {
            Curl_printable_address(pCStack_1c8,(char *)&ss.buffer.sa_stor.__ss_align,0x100);
            ftpc._4_4_ = fcmd;
            do {
              if (ftpc._4_4_ == DONE) goto LAB_008c75ba;
              if ((((((conn->bits).ftp_use_eprt & 1U) != 0) || (ftpc._4_4_ != EPRT)) &&
                  ((ftpc._4_4_ != PORT || ((ushort)res == 2)))) && ((ushort)res == 2)) {
                uVar3 = ntohs(*(uint16_t *)(tmp._1016_8_ + 2));
                if (ftpc._4_4_ == EPRT) {
                  uVar10 = 2;
                  if ((ushort)res == 2) {
                    uVar10 = 1;
                  }
                  ftpc._0_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s |%d|%s|%hu|",
                                             ftp_state_use_port::mode,uVar10,
                                             (undefined1 *)((long)&ss.buffer + 0x78),(ulong)uVar3);
                  if ((CURLcode)ftpc != CURLE_OK) {
                    pcVar7 = curl_easy_strerror((CURLcode)ftpc);
                    Curl_failf(data_00,"Failure sending EPRT command: %s",pcVar7);
                    Curl_closesocket(conn,myhost._252_4_);
                    (conn->proto).ftpc.count1 = 1;
                    _state(conn,FTP_STOP);
                    return (CURLcode)ftpc;
                  }
                  goto LAB_008c75ba;
                }
                if (ftpc._4_4_ == PORT) {
                  dest = (char *)&ss.buffer.sa_stor.__ss_align;
                  local_a50 = &error;
                  while( true ) {
                    bVar11 = false;
                    if (dest != (char *)0x0) {
                      bVar11 = *dest != '\0';
                    }
                    if (!bVar11) break;
                    if (*dest == '.') {
                      *(undefined1 *)local_a50 = 0x2c;
                    }
                    else {
                      *(char *)local_a50 = *dest;
                    }
                    local_a50 = (int *)((long)local_a50 + 1);
                    dest = dest + 1;
                  }
                  *(undefined1 *)local_a50 = 0;
                  curl_msnprintf((char *)local_a50,0x14,",%d,%d",
                                 (ulong)(uint)((int)(uint)uVar3 >> 8),(ulong)(uVar3 & 0xff));
                  ftpc._0_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s %s",0x93ebcd,&error);
                  if ((CURLcode)ftpc != CURLE_OK) {
                    pcVar7 = curl_easy_strerror((CURLcode)ftpc);
                    Curl_failf(data_00,"Failure sending PORT command: %s",pcVar7);
                    Curl_closesocket(conn,myhost._252_4_);
                    _state(conn,FTP_STOP);
                    return (CURLcode)ftpc;
                  }
LAB_008c75ba:
                  (conn->proto).ftpc.count1 = ftpc._4_4_;
                  if (conn->sock[1] != -1) {
                    Curl_closesocket(conn,conn->sock[1]);
                  }
                  conn->sock[1] = myhost._252_4_;
                  (conn->bits).tcpconnect[1] = true;
                  _state(conn,FTP_PORT);
                  return (CURLcode)ftpc;
                }
              }
              ftpc._4_4_ = ftpc._4_4_ + PORT;
            } while( true );
          }
          piVar9 = __errno_location();
          pcVar7 = Curl_strerror(conn,*piVar9);
          Curl_failf(data_00,"socket failure: %s",pcVar7);
          Curl_closesocket(conn,myhost._252_4_);
        }
        else {
          piVar9 = __errno_location();
          pcVar7 = Curl_strerror(conn,*piVar9);
          Curl_failf(data_00,"getsockname() failed: %s",pcVar7);
          Curl_closesocket(conn,myhost._252_4_);
        }
      }
    }
  }
  return CURLE_FTP_PORT_FAILED;
}

Assistant:

static CURLcode ftp_state_use_port(struct connectdata *conn,
                                   ftpport fcmd) /* start with this */

{
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct SessionHandle *data=conn->data;
  curl_socket_t portsock= CURL_SOCKET_BAD;
  char myhost[256] = "";

  struct Curl_sockaddr_storage ss;
  Curl_addrinfo *res, *ai;
  curl_socklen_t sslen;
  char hbuf[NI_MAXHOST];
  struct sockaddr *sa=(struct sockaddr *)&ss;
  struct sockaddr_in * const sa4 = (void *)sa;
#ifdef ENABLE_IPV6
  struct sockaddr_in6 * const sa6 = (void *)sa;
#endif
  char tmp[1024];
  static const char mode[][5] = { "EPRT", "PORT" };
  int rc;
  int error;
  char *host = NULL;
  char *string_ftpport = data->set.str[STRING_FTPPORT];
  struct Curl_dns_entry *h=NULL;
  unsigned short port_min = 0;
  unsigned short port_max = 0;
  unsigned short port;
  bool possibly_non_local = TRUE;

  char *addr = NULL;

  /* Step 1, figure out what is requested,
   * accepted format :
   * (ipv4|ipv6|domain|interface)?(:port(-range)?)?
   */

  if(data->set.str[STRING_FTPPORT] &&
     (strlen(data->set.str[STRING_FTPPORT]) > 1)) {

#ifdef ENABLE_IPV6
    size_t addrlen = INET6_ADDRSTRLEN > strlen(string_ftpport) ?
      INET6_ADDRSTRLEN : strlen(string_ftpport);
#else
    size_t addrlen = INET_ADDRSTRLEN > strlen(string_ftpport) ?
      INET_ADDRSTRLEN : strlen(string_ftpport);
#endif
    char *ip_start = string_ftpport;
    char *ip_end = NULL;
    char *port_start = NULL;
    char *port_sep = NULL;

    addr = calloc(addrlen+1, 1);
    if(!addr)
      return CURLE_OUT_OF_MEMORY;

#ifdef ENABLE_IPV6
    if(*string_ftpport == '[') {
      /* [ipv6]:port(-range) */
      ip_start = string_ftpport + 1;
      if((ip_end = strchr(string_ftpport, ']')) != NULL )
        strncpy(addr, ip_start, ip_end - ip_start);
    }
    else
#endif
      if(*string_ftpport == ':') {
        /* :port */
        ip_end = string_ftpport;
    }
    else if((ip_end = strchr(string_ftpport, ':')) != NULL) {
        /* either ipv6 or (ipv4|domain|interface):port(-range) */
#ifdef ENABLE_IPV6
      if(Curl_inet_pton(AF_INET6, string_ftpport, sa6) == 1) {
        /* ipv6 */
        port_min = port_max = 0;
        strcpy(addr, string_ftpport);
        ip_end = NULL; /* this got no port ! */
      }
      else
#endif
        /* (ipv4|domain|interface):port(-range) */
        strncpy(addr, string_ftpport, ip_end - ip_start );
    }
    else
      /* ipv4|interface */
      strcpy(addr, string_ftpport);

    /* parse the port */
    if(ip_end != NULL) {
      if((port_start = strchr(ip_end, ':')) != NULL) {
        port_min = curlx_ultous(strtoul(port_start+1, NULL, 10));
        if((port_sep = strchr(port_start, '-')) != NULL) {
          port_max = curlx_ultous(strtoul(port_sep + 1, NULL, 10));
        }
        else
          port_max = port_min;
      }
    }

    /* correct errors like:
     *  :1234-1230
     *  :-4711 , in this case port_min is (unsigned)-1,
     *           therefore port_min > port_max for all cases
     *           but port_max = (unsigned)-1
     */
    if(port_min > port_max )
      port_min = port_max = 0;


    if(*addr != '\0') {
      /* attempt to get the address of the given interface name */
      switch(Curl_if2ip(conn->ip_addr->ai_family,
                        Curl_ipv6_scope(conn->ip_addr->ai_addr),
                        conn->scope_id, addr, hbuf, sizeof(hbuf))) {
        case IF2IP_NOT_FOUND:
          /* not an interface, use the given string as host name instead */
          host = addr;
          break;
        case IF2IP_AF_NOT_SUPPORTED:
          return CURLE_FTP_PORT_FAILED;
        case IF2IP_FOUND:
          host = hbuf; /* use the hbuf for host name */
      }
    }
    else
      /* there was only a port(-range) given, default the host */
      host = NULL;
  } /* data->set.ftpport */

  if(!host) {
    /* not an interface and not a host name, get default by extracting
       the IP from the control connection */

    sslen = sizeof(ss);
    if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
      failf(data, "getsockname() failed: %s",
          Curl_strerror(conn, SOCKERRNO) );
      free(addr);
      return CURLE_FTP_PORT_FAILED;
    }
    switch(sa->sa_family) {
#ifdef ENABLE_IPV6
    case AF_INET6:
      Curl_inet_ntop(sa->sa_family, &sa6->sin6_addr, hbuf, sizeof(hbuf));
      break;
#endif
    default:
      Curl_inet_ntop(sa->sa_family, &sa4->sin_addr, hbuf, sizeof(hbuf));
      break;
    }
    host = hbuf; /* use this host name */
    possibly_non_local = FALSE; /* we know it is local now */
  }

  /* resolv ip/host to ip */
  rc = Curl_resolv(conn, host, 0, &h);
  if(rc == CURLRESOLV_PENDING)
    (void)Curl_resolver_wait_resolv(conn, &h);
  if(h) {
    res = h->addr;
    /* when we return from this function, we can forget about this entry
       to we can unlock it now already */
    Curl_resolv_unlock(data, h);
  } /* (h) */
  else
    res = NULL; /* failure! */

  if(res == NULL) {
    failf(data, "failed to resolve the address provided to PORT: %s", host);
    free(addr);
    return CURLE_FTP_PORT_FAILED;
  }

  free(addr);
  host = NULL;

  /* step 2, create a socket for the requested address */

  portsock = CURL_SOCKET_BAD;
  error = 0;
  for(ai = res; ai; ai = ai->ai_next) {
    result = Curl_socket(conn, ai, NULL, &portsock);
    if(result) {
      error = SOCKERRNO;
      continue;
    }
    break;
  }
  if(!ai) {
    failf(data, "socket failure: %s", Curl_strerror(conn, error));
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 3, bind to a suitable local address */

  memcpy(sa, ai->ai_addr, ai->ai_addrlen);
  sslen = ai->ai_addrlen;

  for(port = port_min; port <= port_max;) {
    if(sa->sa_family == AF_INET)
      sa4->sin_port = htons(port);
#ifdef ENABLE_IPV6
    else
      sa6->sin6_port = htons(port);
#endif
    /* Try binding the given address. */
    if(bind(portsock, sa, sslen) ) {
      /* It failed. */
      error = SOCKERRNO;
      if(possibly_non_local && (error == EADDRNOTAVAIL)) {
        /* The requested bind address is not local.  Use the address used for
         * the control connection instead and restart the port loop
         */

        infof(data, "bind(port=%hu) on non-local address failed: %s\n", port,
              Curl_strerror(conn, error) );

        sslen = sizeof(ss);
        if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
          failf(data, "getsockname() failed: %s",
                Curl_strerror(conn, SOCKERRNO) );
          Curl_closesocket(conn, portsock);
          return CURLE_FTP_PORT_FAILED;
        }
        port = port_min;
        possibly_non_local = FALSE; /* don't try this again */
        continue;
      }
      else if(error != EADDRINUSE && error != EACCES) {
        failf(data, "bind(port=%hu) failed: %s", port,
              Curl_strerror(conn, error) );
        Curl_closesocket(conn, portsock);
        return CURLE_FTP_PORT_FAILED;
      }
    }
    else
      break;

    port++;
  }

  /* maybe all ports were in use already*/
  if(port > port_max) {
    failf(data, "bind() failed, we ran out of ports!");
    Curl_closesocket(conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* get the name again after the bind() so that we can extract the
     port number it uses now */
  sslen = sizeof(ss);
  if(getsockname(portsock, (struct sockaddr *)sa, &sslen)) {
    failf(data, "getsockname() failed: %s",
          Curl_strerror(conn, SOCKERRNO) );
    Curl_closesocket(conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 4, listen on the socket */

  if(listen(portsock, 1)) {
    failf(data, "socket failure: %s", Curl_strerror(conn, SOCKERRNO));
    Curl_closesocket(conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 5, send the proper FTP command */

  /* get a plain printable version of the numerical address to work with
     below */
  Curl_printable_address(ai, myhost, sizeof(myhost));

#ifdef ENABLE_IPV6
  if(!conn->bits.ftp_use_eprt && conn->bits.ipv6)
    /* EPRT is disabled but we are connected to a IPv6 host, so we ignore the
       request and enable EPRT again! */
    conn->bits.ftp_use_eprt = TRUE;
#endif

  for(; fcmd != DONE; fcmd++) {

    if(!conn->bits.ftp_use_eprt && (EPRT == fcmd))
      /* if disabled, goto next */
      continue;

    if((PORT == fcmd) && sa->sa_family != AF_INET)
      /* PORT is IPv4 only */
      continue;

    switch(sa->sa_family) {
    case AF_INET:
      port = ntohs(sa4->sin_port);
      break;
#ifdef ENABLE_IPV6
    case AF_INET6:
      port = ntohs(sa6->sin6_port);
      break;
#endif
    default:
      continue; /* might as well skip this */
    }

    if(EPRT == fcmd) {
      /*
       * Two fine examples from RFC2428;
       *
       * EPRT |1|132.235.1.2|6275|
       *
       * EPRT |2|1080::8:800:200C:417A|5282|
       */

      result = Curl_pp_sendf(&ftpc->pp, "%s |%d|%s|%hu|", mode[fcmd],
                             sa->sa_family == AF_INET?1:2,
                             myhost, port);
      if(result) {
        failf(data, "Failure sending EPRT command: %s",
              curl_easy_strerror(result));
        Curl_closesocket(conn, portsock);
        /* don't retry using PORT */
        ftpc->count1 = PORT;
        /* bail out */
        state(conn, FTP_STOP);
        return result;
      }
      break;
    }
    else if(PORT == fcmd) {
      char *source = myhost;
      char *dest = tmp;

      /* translate x.x.x.x to x,x,x,x */
      while(source && *source) {
        if(*source == '.')
          *dest=',';
        else
          *dest = *source;
        dest++;
        source++;
      }
      *dest = 0;
      snprintf(dest, 20, ",%d,%d", (int)(port>>8), (int)(port&0xff));

      result = Curl_pp_sendf(&ftpc->pp, "%s %s", mode[fcmd], tmp);
      if(result) {
        failf(data, "Failure sending PORT command: %s",
              curl_easy_strerror(result));
        Curl_closesocket(conn, portsock);
        /* bail out */
        state(conn, FTP_STOP);
        return result;
      }
      break;
    }
  }

  /* store which command was sent */
  ftpc->count1 = fcmd;

  /* we set the secondary socket variable to this for now, it is only so that
     the cleanup function will close it in case we fail before the true
     secondary stuff is made */
  if(CURL_SOCKET_BAD != conn->sock[SECONDARYSOCKET])
    Curl_closesocket(conn, conn->sock[SECONDARYSOCKET]);
  conn->sock[SECONDARYSOCKET] = portsock;

  /* this tcpconnect assignment below is a hackish work-around to make the
     multi interface with active FTP work - as it will not wait for a
     (passive) connect in Curl_is_connected().

     The *proper* fix is to make sure that the active connection from the
     server is done in a non-blocking way. Currently, it is still BLOCKING.
  */
  conn->bits.tcpconnect[SECONDARYSOCKET] = TRUE;

  state(conn, FTP_PORT);
  return result;
}